

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::
TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
::Matches(TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<std::__cxx11::string_const&>,testing::Matcher<std::chrono::duration<long,std::ratio<1l,1000l>>>>,std::tuple<std::__cxx11::string_const&,std::chrono::duration<long,std::ratio<1l,1000l>>>>
                    ((tuple<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                      *)(this + 0xf0),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_&>
            ::Matches((MatcherBase<const_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_&>
                       *)(this + 0x120),args);
    return bVar1;
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }